

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::operator()(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
             *this,basic_string_view<wchar_t> value)

{
  char cVar1;
  basic_buffer<wchar_t> *pbVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  format_specs *spec;
  wchar_t *data;
  str_writer<wchar_t> local_40;
  
  uVar5 = value.size_;
  spec = this->specs_;
  if (spec == (format_specs *)0x0) {
    pbVar2 = (this->writer_).out_.container;
    sVar3 = pbVar2->size_;
    uVar4 = sVar3 + uVar5;
    if (pbVar2->capacity_ < uVar4) {
      (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar4);
    }
    pbVar2->size_ = uVar4;
    if (uVar5 != 0) {
      memmove(pbVar2->ptr_ + sVar3,value.data_,uVar5 << 2);
    }
  }
  else {
    cVar1 = (spec->super_core_format_specs).type;
    if ((cVar1 != '\0') && (cVar1 != 's')) {
      error_handler::on_error((error_handler *)&local_40,"invalid type specifier");
      spec = this->specs_;
    }
    uVar4 = (ulong)(spec->super_core_format_specs).precision;
    local_40.size_ = uVar5;
    if (uVar4 < uVar5) {
      local_40.size_ = uVar4;
    }
    if ((long)uVar4 < 0) {
      local_40.size_ = uVar5;
    }
    local_40.s = value.data_;
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
    ::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::str_writer<wchar_t>>
              ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
                *)this,&spec->super_align_spec,&local_40);
  }
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }